

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-filter-ex.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  VideoCapture cap;
  Mat frame;
  allocator local_e9;
  undefined4 local_e8;
  undefined4 uStack_e4;
  Mat *local_e0;
  undefined8 auStack_d8 [2];
  char **local_c8;
  _OutputArray local_c0 [2];
  undefined1 *local_90 [2];
  undefined1 local_80 [80];
  
  ac::init();
  if (argc == 2) {
    std::__cxx11::string::string((string *)local_90,argv[1],(allocator *)&local_e8);
    cv::VideoCapture::VideoCapture((VideoCapture *)local_c0,(string *)local_90,0);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
    cVar1 = cv::VideoCapture::isOpened();
    local_c8 = argv;
    if (cVar1 != '\0') {
      lVar5 = 0;
      while( true ) {
        iVar2 = ac::getFilterCount();
        if (iVar2 <= lVar5) break;
        iVar2 = 0x1e;
        lVar6 = lVar5 * 0x20;
        do {
          cv::Mat::Mat((Mat *)local_90);
          auStack_d8[0] = 0;
          local_e8 = 0x2010000;
          local_e0 = (Mat *)local_90;
          cVar1 = cv::VideoCapture::read(local_c0);
          if (cVar1 == '\0') {
            std::__cxx11::string::string((string *)&local_e8,local_c8[1],&local_e9);
            cv::VideoCapture::open((string *)local_c0,(int)(string *)&local_e8);
            if ((undefined8 *)CONCAT44(uStack_e4,local_e8) != auStack_d8) {
              operator_delete((undefined8 *)CONCAT44(uStack_e4,local_e8));
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/",1);
            iVar3 = ac::getFilterCount();
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] - calling.. ",0xe);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar4,*(char **)(ac::draw_strings_abi_cxx11_ + lVar6),
                                *(long *)(ac::draw_strings_abi_cxx11_ + 8 + lVar6));
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
            ac::CallFilter((int)lVar5,(Mat *)local_90);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"call complete [",0xf);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,
                                *(char **)(ac::draw_strings_abi_cxx11_ + lVar6),
                                *(long *)(ac::draw_strings_abi_cxx11_ + 8 + lVar6));
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]\n",2);
          }
          cv::Mat::~Mat((Mat *)local_90);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
        lVar5 = lVar5 + 1;
      }
      cv::VideoCapture::~VideoCapture((VideoCapture *)local_c0);
      return 0;
    }
    std::operator<<((ostream *)&std::cerr,"Error capture device not opened..\n");
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Error requires file argument..\n");
  }
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
    
    ac::init();
    
    if(argc != 2) {
        std::cerr << "Error requires file argument..\n";
        exit(EXIT_FAILURE);
    }
    cv::VideoCapture cap(argv[1]);
    if(!cap.isOpened()) {
        std::cerr << "Error capture device not opened..\n";
        exit(EXIT_FAILURE);
    }
    for(int i = 0; i < ac::getFilterCount(); ++i) {
        
        //	if( ac::draw_strings[i].find("Shuffle") != std::string::npos ||  ac::draw_strings[i].find("Rand") != std::string::npos ||  ac::draw_strings[i].find("Frame") != std::string::npos )
        //		continue;
        
        //		if(ac::draw_strings[i].find("Random") != std::string::npos)
        //			continue;
        
        for(int q = 0; q < 30; ++q) {
            cv::Mat frame;
            if(cap.read(frame)) {
                std::cout << "[" << i << "/" << ac::getFilterCount() << "] - calling.. " << ac::draw_strings[i] << "\n";
                ac::CallFilter(i, frame);
                std::cout << "call complete [" << ac::draw_strings[i] << "]\n";
            } else {
                cap.open(argv[1]);
            }
        }
    }
    return 0;
}